

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

FieldBase * __thiscall
FIX::Message::extractField
          (FieldBase *__return_storage_ptr__,Message *this,string *string,size_type *pos,
          DataDictionary *pSessionDD,DataDictionary *pAppDD,Group *pGroup)

{
  const_iterator __end;
  bool bVar1;
  int iVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  InvalidMessage *pIVar3;
  FieldBase *this_00;
  string *value;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first_00;
  size_type sVar4;
  const_iterator tagEnd;
  FieldNotFound *anon_var_0;
  FieldConvertError *e;
  FieldBase *fieldLength;
  FieldMap *location;
  int lenField;
  char local_161;
  char *local_160;
  char *local_158;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  const_iterator soh;
  const_iterator valueStart;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  char *local_c0;
  char *local_b8;
  int local_ac;
  undefined1 local_a5;
  int field;
  allocator<char> local_91;
  string local_90;
  char local_69;
  char *local_68;
  char *local_60;
  const_iterator local_58;
  const_iterator equalSign;
  const_iterator strEnd;
  const_iterator tagStart;
  DataDictionary *pAppDD_local;
  DataDictionary *pSessionDD_local;
  size_type *pos_local;
  string *string_local;
  Message *this_local;
  
  strEnd._M_current = (char *)std::__cxx11::string::begin();
  __first = __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator+(&strEnd,*pos);
  local_68 = (char *)std::__cxx11::string::end();
  local_69 = '=';
  local_60 = __first._M_current;
  equalSign._M_current = local_68;
  local_58._M_current =
       (char *)std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                         (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )local_68,&local_69);
  bVar1 = __gnu_cxx::operator==(&local_58,&equalSign);
  if (bVar1) {
    local_a5 = 1;
    pIVar3 = (InvalidMessage *)__cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"Equal sign not found in field",&local_91);
    InvalidMessage::InvalidMessage(pIVar3,&local_90);
    local_a5 = 0;
    __cxa_throw(pIVar3,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
  }
  local_ac = 0;
  local_c0 = local_58._M_current;
  local_b8 = __first._M_current;
  bVar1 = IntTConvertor<int>::convert((const_iterator)__first._M_current,local_58,&local_ac);
  if (bVar1) {
    local_158 = (char *)__gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator+(&local_58,1);
    local_160 = equalSign._M_current;
    local_161 = '\x01';
    soh._M_current = local_158;
    local_150 = std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_158,equalSign._M_current,&local_161);
    bVar1 = __gnu_cxx::operator==(&local_150,&equalSign);
    if (bVar1) {
      location._6_1_ = 1;
      pIVar3 = (InvalidMessage *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lenField,"SOH not found at end of field",
                 (allocator<char> *)((long)&location + 7));
      InvalidMessage::InvalidMessage(pIVar3,(string *)&lenField);
      location._6_1_ = 0;
      __cxa_throw(pIVar3,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
    }
    bVar1 = IsDataField(local_ac,pSessionDD,pAppDD);
    if (bVar1) {
      location._0_4_ = local_ac + -1;
      if (local_ac == 0x59) {
        location._0_4_ = 0x5d;
      }
      fieldLength = (FieldBase *)pGroup;
      if (pGroup == (Group *)0x0) {
        bVar1 = isHeaderField((int)location,pSessionDD);
        if (bVar1) {
          fieldLength = (FieldBase *)&this->m_header;
        }
        else {
          bVar1 = isTrailerField((int)location,pSessionDD);
          fieldLength = (FieldBase *)this;
          if (bVar1) {
            fieldLength = (FieldBase *)&this->m_trailer;
          }
        }
      }
      this_00 = FieldMap::reverse_find((FieldMap *)fieldLength,(int)location);
      value = FieldBase::getString_abi_cxx11_(this_00);
      iVar2 = IntTConvertor<int>::convert(value);
      local_150 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator+(&soh,(long)iVar2);
    }
    __last = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_150,1);
    __first_00._M_current = (char *)std::__cxx11::string::begin();
    sVar4 = std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (__first_00,__last);
    *pos = sVar4;
    FieldBase::FieldBase
              (__return_storage_ptr__,local_ac,soh,(const_iterator)local_150._M_current,
               (const_iterator)__first._M_current,(const_iterator)__last._M_current);
    return __return_storage_ptr__;
  }
  valueStart._M_current._6_1_ = 1;
  pIVar3 = (InvalidMessage *)__cxa_allocate_exception(0x50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Field tag is invalid: ",&local_101);
  __end._M_current = local_58._M_current;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            ((string *)&local_128,__first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__end._M_current,(allocator<char> *)((long)&valueStart._M_current + 7));
  std::operator+(&local_e0,&local_100,&local_128);
  InvalidMessage::InvalidMessage(pIVar3,&local_e0);
  valueStart._M_current._6_1_ = 0;
  __cxa_throw(pIVar3,&InvalidMessage::typeinfo,InvalidMessage::~InvalidMessage);
}

Assistant:

FIX::FieldBase Message::extractField(
    const std::string &string,
    std::string::size_type &pos,
    const DataDictionary *pSessionDD /*= 0*/,
    const DataDictionary *pAppDD /*= 0*/,
    const Group *pGroup /*= 0*/) const {
  std::string::const_iterator const tagStart = string.begin() + pos;
  std::string::const_iterator const strEnd = string.end();

  std::string::const_iterator const equalSign = std::find(tagStart, strEnd, '=');
  if (equalSign == strEnd) {
    throw InvalidMessage("Equal sign not found in field");
  }

  int field = 0;
  if (!IntConvertor::convert(tagStart, equalSign, field)) {
    throw InvalidMessage(std::string("Field tag is invalid: ") + std::string(tagStart, equalSign));
  }

  std::string::const_iterator const valueStart = equalSign + 1;

  std::string::const_iterator soh = std::find(valueStart, strEnd, '\001');
  if (soh == strEnd) {
    throw InvalidMessage("SOH not found at end of field");
  }

  if (IsDataField(field, pSessionDD, pAppDD)) {
    // Assume length field is 1 less.
    int lenField = field - 1;
    // Special case for Signature which violates above assumption.
    if (field == FIELD::Signature) {
      lenField = FIELD::SignatureLength;
    }

    // identify part of the message that should contain length field
    const FieldMap *location = pGroup;
    if (!location) {
      if (isHeaderField(lenField, pSessionDD)) {
        location = &m_header;
      } else if (isTrailerField(lenField, pSessionDD)) {
        location = &m_trailer;
      } else {
        location = this;
      }
    }

    try {
      const FieldBase &fieldLength = location->reverse_find(lenField);
      soh = valueStart + IntConvertor::convert(fieldLength.getString());
    } catch (FieldNotFound &) {
      throw InvalidMessage(
          std::string("Data length field ") + IntConvertor::convert(lenField)
          + std::string(" was not found for data field ") + IntConvertor::convert(field));
    } catch (FieldConvertError &e) {
      throw InvalidMessage(
          std::string("Unable to determine SOH for data field ") + IntConvertor::convert(field) + std::string(": ")
          + e.what());
    }
  }

  std::string::const_iterator const tagEnd = soh + 1;
#if defined(__SUNPRO_CC)
  std::distance(string.begin(), tagEnd, pos);
#else
  pos = std::distance(string.begin(), tagEnd);
#endif

  return FieldBase(field, valueStart, soh, tagStart, tagEnd);
}